

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O3

void __thiscall
Imf_2_5::TypedDeepImageChannel<float>::moveSamplesToNewBuffer
          (TypedDeepImageChannel<float> *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  size_t sVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  size_t sVar8;
  SampleCountChannel *pSVar9;
  float *pfVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  
  pfVar3 = this->_sampleBuffer;
  pSVar9 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  pfVar10 = (float *)operator_new__(-(ulong)(pSVar9->_sampleBufferSize >> 0x3e != 0) |
                                    pSVar9->_sampleBufferSize << 2);
  this->_sampleBuffer = pfVar10;
  sVar4 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  if (sVar4 != 0) {
    sVar12 = 0;
    do {
      ppfVar5 = this->_sampleListPointers;
      pfVar6 = this->_sampleBuffer;
      pfVar7 = ppfVar5[sVar12];
      sVar8 = newSampleListPositions[sVar12];
      pfVar10 = pfVar6 + sVar8;
      uVar1 = oldNumSamples[sVar12];
      uVar11 = (ulong)uVar1;
      uVar2 = newNumSamples[sVar12];
      if (uVar2 < uVar1) {
        if ((ulong)uVar2 != 0) {
          uVar11 = 0;
          do {
            pfVar10[uVar11] = pfVar7[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar2 != uVar11);
        }
      }
      else {
        if (uVar11 != 0) {
          uVar13 = 0;
          do {
            pfVar10[uVar13] = pfVar7[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar11 != uVar13);
        }
        if (uVar1 < uVar2) {
          memset(pfVar6 + sVar8 + uVar11,0,(ulong)(~uVar1 + uVar2) * 4 + 4);
        }
      }
      ppfVar5[sVar12] = pfVar10;
      sVar12 = sVar12 + 1;
    } while (sVar12 != sVar4);
  }
  if (pfVar3 == (float *)0x0) {
    return;
  }
  operator_delete__(pfVar3);
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSamplesToNewBuffer
    (const unsigned int * oldNumSamples,
     const unsigned int * newNumSamples,
     const size_t * newSampleListPositions)
{
    //
    // Allocate a new sample buffer for this channel.
    // Copy the sample lists for all pixels into the new buffer.
    // Then delete the old sample buffer.
    //
    // oldNumSamples            Number of samples in each sample list in the
    //                          old sample buffer.
    //
    // newNumSamples            Number of samples in each sample list in
    //                          the new sample buffer.  If the new number
    //                          of samples is larger than the old number of
    //                          samples for a given sample list, then the
    //                          end of the new sample list is filled with
    //                          zeroes.  If the new number of samples is
    //                          smaller than the old one, then samples at
    //                          the end of the old sample list are discarded.
    //
    // newSampleListPositions   The positions of the new sample lists in the
    //                          new sample buffer.
    //

    T * oldSampleBuffer = _sampleBuffer;
    _sampleBuffer = new T [sampleCounts().sampleBufferSize()];

    for (size_t i = 0; i < numPixels(); ++i)
    {
        T * oldSampleList = _sampleListPointers[i];
        T * newSampleList = _sampleBuffer + newSampleListPositions[i];

        if (oldNumSamples[i] > newNumSamples[i])
        {
            for (unsigned int j = 0; j < newNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];
        }
        else
        {
            for (unsigned int j = 0; j < oldNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];

            for (unsigned int j = oldNumSamples[i]; j < newNumSamples[i]; ++j)
                newSampleList[j] = 0;
        }

        _sampleListPointers[i] = newSampleList;
    }

    delete [] oldSampleBuffer;
}